

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractfileengine.cpp
# Opt level: O3

void __thiscall
QAbstractFileEngineHandler::QAbstractFileEngineHandler(QAbstractFileEngineHandler *this)

{
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fileEngineHandlers>_> *this_00;
  QPodArrayOps<QAbstractFileEngineHandler*> *this_01;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fileEngineHandlers>_> *this_02;
  long in_FS_OFFSET;
  QAbstractFileEngineHandler *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this->_vptr_QAbstractFileEngineHandler = (_func_int **)&PTR__QAbstractFileEngineHandler_00696140;
  this_02 = (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fileEngineHandlers>_>
             *)this;
  this_00 = (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fileEngineHandlers>_>
             *)QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fileEngineHandlerMutex>_>
               ::operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fileEngineHandlerMutex>_>
                             *)this);
  if (((ulong)this_00 & 1) == 0 &&
      this_00 !=
      (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fileEngineHandlers>_> *)0x0
     ) {
    this_02 = this_00;
    QReadWriteLock::lockForWrite((QReadWriteLock *)this_00);
    this_00 = (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fileEngineHandlers>_>
               *)((ulong)this_00 | 1);
  }
  qt_file_engine_handlers_in_use._q_value.super___atomic_base<int>._M_i =
       (Type)(__atomic_base<int>)0x1;
  this_01 = (QPodArrayOps<QAbstractFileEngineHandler*> *)
            QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fileEngineHandlers>_>
            ::operator()(this_02);
  local_20 = this;
  QtPrivate::QPodArrayOps<QAbstractFileEngineHandler*>::emplace<QAbstractFileEngineHandler*&>
            (this_01,0,&local_20);
  if (((ulong)this_00 & 1) != 0) {
    QReadWriteLock::unlock((QReadWriteLock *)((ulong)this_00 & 0xfffffffffffffffe));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QAbstractFileEngineHandler::QAbstractFileEngineHandler()
{
    QWriteLocker locker(fileEngineHandlerMutex());
    qt_file_engine_handlers_in_use.storeRelaxed(true);
    fileEngineHandlers()->prepend(this);
}